

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O1

void __thiscall glslang::HlslTokenStream::advanceToken(HlslTokenStream *this)

{
  pointer pHVar1;
  HlslToken *pHVar2;
  int *piVar3;
  pointer ppTVar4;
  pointer piVar5;
  TVector<glslang::HlslToken> *pTVar6;
  pointer pHVar7;
  TString *pTVar8;
  undefined8 uVar9;
  TSourceLoc *pTVar10;
  uint uVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar18;
  EHlslTokenClass EVar19;
  undefined4 uVar20;
  
  iVar15 = this->tokenBufferPos;
  this->tokenBuffer[iVar15].field_2 = (this->token).field_2;
  pTVar8 = (this->token).loc.name;
  iVar16 = (this->token).loc.string;
  iVar17 = (this->token).loc.line;
  uVar13 = *(undefined4 *)&(this->token).loc.field_0x14;
  uVar9 = *(undefined8 *)&(this->token).tokenClass;
  pTVar10 = &this->tokenBuffer[iVar15].loc;
  pTVar10->column = (this->token).loc.column;
  *(undefined4 *)&pTVar10->field_0x14 = uVar13;
  pTVar10[1].name = uVar9;
  pHVar2 = this->tokenBuffer + iVar15;
  (pHVar2->loc).name = pTVar8;
  (pHVar2->loc).string = iVar16;
  (pHVar2->loc).line = iVar17;
  iVar15 = this->tokenBufferPos;
  this->tokenBufferPos = (iVar15 - ((iVar15 - (iVar15 + 1 >> 0x1f)) + 1U & 0xfffffffe)) + 1;
  if (this->preTokenStackSize < 1) {
    ppTVar4 = (this->tokenStreamStack).
              super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
              .
              super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar4 ==
        (this->tokenStreamStack).
        super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        .
        super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      HlslScanContext::tokenize(this->scanner,&this->token);
      return;
    }
    piVar5 = (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
             super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar12 = (long)piVar5[-1] + 1;
    piVar5[-1] = (int)lVar12;
    pTVar6 = ppTVar4[-1];
    pHVar7 = (pTVar6->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
             ).super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pTVar6->
                            super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                            ).
                            super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar7) >> 3) *
        -0x33333333 <= (int)lVar12) {
      (this->token).tokenClass = EHTokNone;
      return;
    }
    (this->token).field_2 = pHVar7[lVar12].field_2;
    pHVar1 = pHVar7 + lVar12;
    uVar13 = *(undefined4 *)&(pHVar1->loc).name;
    uVar14 = *(undefined4 *)((long)&(pHVar1->loc).name + 4);
    iVar15 = (pHVar1->loc).string;
    iVar16 = (pHVar1->loc).line;
    piVar3 = &pHVar7[lVar12].loc.column;
    iVar17 = *piVar3;
    uVar18 = piVar3[1];
    EVar19 = piVar3[2];
    uVar20 = piVar3[3];
  }
  else {
    uVar11 = this->preTokenStackSize - 1;
    this->preTokenStackSize = uVar11;
    (this->token).field_2 = this->preTokenStack[uVar11].field_2;
    pHVar2 = this->preTokenStack + uVar11;
    uVar13 = *(undefined4 *)&(pHVar2->loc).name;
    uVar14 = *(undefined4 *)((long)&(pHVar2->loc).name + 4);
    iVar15 = (pHVar2->loc).string;
    iVar16 = (pHVar2->loc).line;
    piVar3 = &this->preTokenStack[uVar11].loc.column;
    iVar17 = *piVar3;
    uVar18 = piVar3[1];
    EVar19 = piVar3[2];
    uVar20 = piVar3[3];
  }
  (this->token).loc.column = iVar17;
  *(undefined4 *)&(this->token).loc.field_0x14 = uVar18;
  (this->token).tokenClass = EVar19;
  *(undefined4 *)&(this->token).field_0x1c = uVar20;
  *(undefined4 *)&(this->token).loc.name = uVar13;
  *(undefined4 *)((long)&(this->token).loc.name + 4) = uVar14;
  (this->token).loc.string = iVar15;
  (this->token).loc.line = iVar16;
  return;
}

Assistant:

void HlslTokenStream::advanceToken()
{
    pushTokenBuffer(token);
    if (preTokenStackSize > 0)
        token = popPreToken();
    else {
        if (tokenStreamStack.size() == 0)
            scanner.tokenize(token);
        else {
            ++tokenPosition.back();
            if (tokenPosition.back() >= (int)tokenStreamStack.back()->size())
                token.tokenClass = EHTokNone;
            else
                token = (*tokenStreamStack.back())[tokenPosition.back()];
        }
    }
}